

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.h
# Opt level: O0

void __thiscall FIX::MemoryStore::reset(MemoryStore *this)

{
  MemoryStore *this_local;
  
  this->m_nextSenderMsgSeqNum = 1;
  this->m_nextTargetMsgSeqNum = 1;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->m_messages);
  UtcTimeStamp::setCurrent(&this->m_creationTime);
  return;
}

Assistant:

void reset() EXCEPT ( IOException )
  {
    m_nextSenderMsgSeqNum = 1; m_nextTargetMsgSeqNum = 1;
    m_messages.clear(); m_creationTime.setCurrent();
  }